

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O0

void __thiscall Solver::solve(Solver *this,int algorithm)

{
  int algorithm_local;
  Solver *this_local;
  
  if (algorithm == 0) {
    solveBFS(this);
  }
  else if (algorithm == 1) {
    solveDFS(this);
  }
  else {
    solveDijkstra(this);
  }
  return;
}

Assistant:

void Solver::solve(int algorithm) {
    if (algorithm == BFS) {
        this->solveBFS();
    } else if (algorithm == DFS) {
        this->solveDFS();
    } else {
        this->solveDijkstra();
    }
}